

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> * __thiscall
TSPStateImp::Neighbor(TSPStateImp *this,vector<int,_std::allocator<int>_> *currentState)

{
  iterator iVar1;
  int iVar2;
  int iVar3;
  vector<int,std::allocator<int>> *this_00;
  pointer piVar4;
  pointer piVar5;
  int iVar6;
  pointer __args;
  bool bVar7;
  
  this_00 = (vector<int,std::allocator<int>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  iVar2 = rand();
  iVar2 = iVar2 % this->n;
  iVar3 = rand();
  iVar3 = iVar3 % this->n;
  iVar6 = iVar3;
  if (iVar3 < iVar2) {
    iVar6 = iVar2;
  }
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  piVar4 = (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  piVar5 = piVar4;
  if (iVar3 != 0) {
    do {
      iVar1._M_current = *(int **)(this_00 + 8);
      if (iVar1._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_00,iVar1,piVar5);
      }
      else {
        *iVar1._M_current = *piVar5;
        *(int **)(this_00 + 8) = iVar1._M_current + 1;
      }
      piVar5 = piVar5 + 1;
      piVar4 = (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
    } while (piVar5 != piVar4 + iVar3);
  }
  piVar5 = (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  __args = piVar4 + iVar6;
  if (piVar4 + iVar6 != piVar5 + (long)iVar3 + -1) {
    do {
      iVar1._M_current = *(int **)(this_00 + 8);
      if (iVar1._M_current == *(int **)(this_00 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_00,iVar1,__args);
      }
      else {
        *iVar1._M_current = *__args;
        *(int **)(this_00 + 8) = iVar1._M_current + 1;
      }
      piVar5 = (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      bVar7 = __args != piVar5 + iVar3;
      __args = __args + -1;
    } while (bVar7);
  }
  piVar5 = piVar5 + iVar6;
  while (piVar5 = piVar5 + 1,
        piVar5 != (currentState->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
    iVar1._M_current = *(int **)(this_00 + 8);
    if (iVar1._M_current == *(int **)(this_00 + 0x10)) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(this_00,iVar1,piVar5);
    }
    else {
      *iVar1._M_current = *piVar5;
      *(int **)(this_00 + 8) = iVar1._M_current + 1;
    }
  }
  return (vector<int,_std::allocator<int>_> *)this_00;
}

Assistant:

std::vector<int> *TSPStateImp::Neighbor(std::vector<int> *currentState)
{
	std::vector<int> *newState = new std::vector<int>;

	int u = rand() % n, v = rand() % n;

	if (u > v)
	{
		std::swap(u, v);
	}

	for (auto iter = currentState->begin(); iter != currentState->begin() + u; ++iter)
	{
		newState->push_back(*iter);
	}

	for (auto iter = currentState->begin() + v; iter != currentState->begin() + u - 1; --iter)
	{
		newState->push_back(*iter);
	}

	for (auto iter = currentState->begin() + v + 1; iter != currentState->end(); ++iter)
	{
		newState->push_back(*iter);
	}

	return newState;
}